

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_sniffer.cpp
# Opt level: O1

SnifferResult * __thiscall
duckdb::CSVSniffer::SniffCSV
          (SnifferResult *__return_storage_ptr__,CSVSniffer *this,bool force_match)

{
  shared_ptr<duckdb::CSVBufferManager,_true> *this_00;
  vector<duckdb::LogicalType,_true> *pvVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *this_01;
  size_t __n;
  vector<duckdb::LogicalType,_true> *pvVar2;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *__x;
  pointer pbVar3;
  SnifferResult *pSVar4;
  char cVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  CSVBufferManager *pCVar9;
  pointer pCVar10;
  pointer pSVar11;
  CSVErrorHandler *pCVar12;
  ulong uVar13;
  const_reference pvVar14;
  reference pvVar15;
  long *plVar16;
  undefined8 *puVar17;
  const_reference pvVar18;
  reference pvVar19;
  InvalidInputException *pIVar20;
  long *plVar21;
  ulong *puVar22;
  undefined8 *puVar23;
  long lVar24;
  undefined7 in_register_00000011;
  string *msg;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *this_02;
  char cVar25;
  undefined8 uVar26;
  ulong uVar27;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_03;
  reference rVar28;
  string __str;
  string type_error;
  undefined8 *local_210;
  undefined8 local_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 *local_1f0;
  undefined8 local_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  ulong *local_1d0;
  long local_1c8;
  ulong local_1c0;
  long lStack_1b8;
  ulong *local_1b0;
  long local_1a8;
  ulong local_1a0;
  long lStack_198;
  undefined4 local_18c;
  string *local_188;
  long *local_180;
  long local_178;
  long local_170;
  long lStack_168;
  long *local_160;
  long local_158;
  long local_150;
  long lStack_148;
  char *local_140;
  uint local_138;
  char local_130 [16];
  undefined1 *local_120 [2];
  undefined1 local_110 [16];
  CSVReaderOptions *local_100;
  vector<duckdb::LogicalType,_true> *local_f8;
  SnifferResult *local_f0;
  string local_e8;
  string local_c8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_a8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_88;
  vector<bool,_true> *local_68;
  pointer local_60 [3];
  pointer local_48 [3];
  
  local_18c = (undefined4)CONCAT71(in_register_00000011,force_match);
  this_00 = &this->buffer_manager;
  local_f0 = __return_storage_ptr__;
  pCVar9 = shared_ptr<duckdb::CSVBufferManager,_true>::operator->(this_00);
  pCVar9->sniffing = true;
  DetectDialect(this);
  pCVar9 = shared_ptr<duckdb::CSVBufferManager,_true>::operator->(this_00);
  pCVar10 = unique_ptr<duckdb::CSVFileHandle,_std::default_delete<duckdb::CSVFileHandle>,_true>::
            operator->(&pCVar9->file_handle);
  if (pCVar10->compression_type != UNCOMPRESSED) {
    pCVar9 = shared_ptr<duckdb::CSVBufferManager,_true>::operator->(this_00);
    bVar6 = CSVBufferManager::IsBlockUnloaded(pCVar9,0);
    if (bVar6) {
      pCVar9 = shared_ptr<duckdb::CSVBufferManager,_true>::operator->(this_00);
      CSVBufferManager::ResetBufferManager(pCVar9);
    }
  }
  DetectTypes(this);
  RefineTypes(this);
  DetectHeader(this);
  ReplaceTypes(this);
  pCVar9 = shared_ptr<duckdb::CSVBufferManager,_true>::operator->(this_00);
  pCVar10 = unique_ptr<duckdb::CSVFileHandle,_std::default_delete<duckdb::CSVFileHandle>,_true>::
            operator->(&pCVar9->file_handle);
  if (pCVar10->compression_type != UNCOMPRESSED) {
    pCVar9 = shared_ptr<duckdb::CSVBufferManager,_true>::operator->(this_00);
    CSVBufferManager::ResetBufferManager(pCVar9);
  }
  pCVar9 = shared_ptr<duckdb::CSVBufferManager,_true>::operator->(this_00);
  pCVar9->sniffing = false;
  pSVar11 = unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
            ::operator->(&this->best_candidate);
  pCVar12 = shared_ptr<duckdb::CSVErrorHandler,_true>::operator->
                      (&(pSVar11->super_BaseScanner).error_handler);
  bVar6 = CSVErrorHandler::AnyErrors(pCVar12);
  if ((bVar6) && ((this->options->ignore_errors).value == false)) {
    pSVar11 = unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
              ::operator->(&this->best_candidate);
    pCVar12 = shared_ptr<duckdb::CSVErrorHandler,_true>::operator->
                        (&(pSVar11->super_BaseScanner).error_handler);
    CSVErrorHandler::ErrorIfTypeExists(pCVar12,MAXIMUM_LINE_SIZE);
  }
  SetResultOptions(this);
  local_100 = this->options;
  local_100->auto_detect = true;
  msg = &local_100->sniffer_user_mismatch_error;
  pvVar1 = (this->set_columns).types;
  if ((pvVar1 != (vector<duckdb::LogicalType,_true> *)0x0) &&
     ((pvVar1->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pvVar1->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    local_120[0] = local_110;
    local_188 = msg;
    if ((local_100->dialect_options).header.value == true) {
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_120,
                 "The Column names set by the user do not match the ones found by the sniffer. \n",
                 "");
      this_01 = (this->set_columns).names;
      if ((long)(this_01->
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this_01->
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start ==
          (long)(this->names).
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->names).
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
        bVar6 = true;
        uVar27 = 0;
        while( true ) {
          pvVar1 = (this->set_columns).types;
          if (pvVar1 == (vector<duckdb::LogicalType,_true> *)0x0) {
            uVar13 = 0;
          }
          else {
            uVar13 = ((long)(pvVar1->
                            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>)
                            .
                            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pvVar1->
                            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>)
                            .
                            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
          }
          if (uVar13 <= uVar27) break;
          pvVar14 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ::operator[](this_01,uVar27);
          pvVar15 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ::operator[](&this->names,uVar27);
          __n = pvVar14->_M_string_length;
          if ((__n != pvVar15->_M_string_length) ||
             ((__n != 0 &&
              (iVar8 = bcmp((pvVar14->_M_dataplus)._M_p,(pvVar15->_M_dataplus)._M_p,__n), iVar8 != 0
              )))) {
            cVar25 = '\x01';
            if (9 < uVar27) {
              uVar13 = uVar27;
              cVar5 = '\x04';
              do {
                cVar25 = cVar5;
                if (uVar13 < 100) {
                  cVar25 = cVar25 + -2;
                  goto LAB_00b95462;
                }
                if (uVar13 < 1000) {
                  cVar25 = cVar25 + -1;
                  goto LAB_00b95462;
                }
                if (uVar13 < 10000) goto LAB_00b95462;
                bVar6 = 99999 < uVar13;
                uVar13 = uVar13 / 10000;
                cVar5 = cVar25 + '\x04';
              } while (bVar6);
              cVar25 = cVar25 + '\x01';
            }
LAB_00b95462:
            local_140 = local_130;
            ::std::__cxx11::string::_M_construct((ulong)&local_140,cVar25);
            ::std::__detail::__to_chars_10_impl<unsigned_long>(local_140,local_138,uVar27);
            plVar16 = (long *)::std::__cxx11::string::replace
                                        ((ulong)&local_140,0,(char *)0x0,0x13b028d);
            plVar21 = plVar16 + 2;
            if ((long *)*plVar16 == plVar21) {
              local_150 = *plVar21;
              lStack_148 = plVar16[3];
              local_160 = &local_150;
            }
            else {
              local_150 = *plVar21;
              local_160 = (long *)*plVar16;
            }
            local_158 = plVar16[1];
            *plVar16 = (long)plVar21;
            plVar16[1] = 0;
            *(undefined1 *)(plVar16 + 2) = 0;
            plVar16 = (long *)::std::__cxx11::string::append((char *)&local_160);
            local_1d0 = &local_1c0;
            puVar22 = (ulong *)(plVar16 + 2);
            if ((ulong *)*plVar16 == puVar22) {
              local_1c0 = *puVar22;
              lStack_1b8 = plVar16[3];
            }
            else {
              local_1c0 = *puVar22;
              local_1d0 = (ulong *)*plVar16;
            }
            local_1c8 = plVar16[1];
            *plVar16 = (long)puVar22;
            plVar16[1] = 0;
            *(undefined1 *)(plVar16 + 2) = 0;
            pvVar14 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      ::operator[](this_01,uVar27);
            puVar17 = (undefined8 *)
                      ::std::__cxx11::string::_M_append
                                ((char *)&local_1d0,(ulong)(pvVar14->_M_dataplus)._M_p);
            local_210 = &local_200;
            puVar23 = puVar17 + 2;
            if ((undefined8 *)*puVar17 == puVar23) {
              local_200 = *puVar23;
              uStack_1f8 = puVar17[3];
            }
            else {
              local_200 = *puVar23;
              local_210 = (undefined8 *)*puVar17;
            }
            local_208 = puVar17[1];
            *puVar17 = puVar23;
            puVar17[1] = 0;
            *(undefined1 *)(puVar17 + 2) = 0;
            plVar16 = (long *)::std::__cxx11::string::append((char *)&local_210);
            local_1b0 = &local_1a0;
            puVar22 = (ulong *)(plVar16 + 2);
            if ((ulong *)*plVar16 == puVar22) {
              local_1a0 = *puVar22;
              lStack_198 = plVar16[3];
            }
            else {
              local_1a0 = *puVar22;
              local_1b0 = (ulong *)*plVar16;
            }
            local_1a8 = plVar16[1];
            *plVar16 = (long)puVar22;
            plVar16[1] = 0;
            *(undefined1 *)(plVar16 + 2) = 0;
            pvVar15 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      ::operator[](&this->names,uVar27);
            puVar17 = (undefined8 *)
                      ::std::__cxx11::string::_M_append
                                ((char *)&local_1b0,(ulong)(pvVar15->_M_dataplus)._M_p);
            local_1f0 = &local_1e0;
            puVar23 = puVar17 + 2;
            if ((undefined8 *)*puVar17 == puVar23) {
              local_1e0 = *puVar23;
              uStack_1d8 = puVar17[3];
            }
            else {
              local_1e0 = *puVar23;
              local_1f0 = (undefined8 *)*puVar17;
            }
            local_1e8 = puVar17[1];
            *puVar17 = puVar23;
            puVar17[1] = 0;
            *(undefined1 *)(puVar17 + 2) = 0;
            plVar16 = (long *)::std::__cxx11::string::append((char *)&local_1f0);
            local_180 = &local_170;
            plVar21 = plVar16 + 2;
            if ((long *)*plVar16 == plVar21) {
              local_170 = *plVar21;
              lStack_168 = plVar16[3];
            }
            else {
              local_170 = *plVar21;
              local_180 = (long *)*plVar16;
            }
            local_178 = plVar16[1];
            *plVar16 = (long)plVar21;
            plVar16[1] = 0;
            *(undefined1 *)(plVar16 + 2) = 0;
            ::std::__cxx11::string::_M_append((char *)local_120,(ulong)local_180);
            if (local_180 != &local_170) {
              operator_delete(local_180);
            }
            if (local_1f0 != &local_1e0) {
              operator_delete(local_1f0);
            }
            if (local_1b0 != &local_1a0) {
              operator_delete(local_1b0);
            }
            if (local_210 != &local_200) {
              operator_delete(local_210);
            }
            if (local_1d0 != &local_1c0) {
              operator_delete(local_1d0);
            }
            if (local_160 != &local_150) {
              operator_delete(local_160);
            }
            if (local_140 != local_130) {
              operator_delete(local_140);
            }
            bVar6 = false;
          }
          uVar27 = uVar27 + 1;
        }
        if (!bVar6) {
          ::std::__cxx11::string::_M_append((char *)local_188,(ulong)local_120[0]);
        }
      }
      if (local_120[0] != local_110) {
        operator_delete(local_120[0]);
      }
    }
    local_120[0] = local_110;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_120,
               "The Column types set by the user do not match the ones found by the sniffer. \n","")
    ;
    pvVar1 = (this->set_columns).types;
    if (pvVar1 == (vector<duckdb::LogicalType,_true> *)0x0) {
      lVar24 = 0;
    }
    else {
      lVar24 = ((long)(pvVar1->
                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(pvVar1->
                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    }
    if (((long)(this->detected_types).
               super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_finish -
         (long)(this->detected_types).
               super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - lVar24 == 0) {
      local_f8 = &this->detected_types;
      local_68 = &this->manually_set;
      bVar6 = true;
      uVar27 = 0;
      while( true ) {
        pvVar2 = (this->set_columns).types;
        if (pvVar2 == (vector<duckdb::LogicalType,_true> *)0x0) {
          uVar13 = 0;
        }
        else {
          uVar13 = ((long)(pvVar2->
                          super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pvVar2->
                          super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
        }
        if (uVar13 <= uVar27) break;
        pvVar18 = vector<duckdb::LogicalType,_true>::operator[](pvVar1,uVar27);
        pvVar19 = vector<duckdb::LogicalType,_true>::operator[](local_f8,uVar27);
        bVar7 = LogicalType::operator==(pvVar18,pvVar19);
        if (!bVar7) {
          cVar25 = '\x01';
          if (9 < uVar27) {
            uVar13 = uVar27;
            cVar5 = '\x04';
            do {
              cVar25 = cVar5;
              if (uVar13 < 100) {
                cVar25 = cVar25 + -2;
                goto LAB_00b9593b;
              }
              if (uVar13 < 1000) {
                cVar25 = cVar25 + -1;
                goto LAB_00b9593b;
              }
              if (uVar13 < 10000) goto LAB_00b9593b;
              bVar6 = 99999 < uVar13;
              uVar13 = uVar13 / 10000;
              cVar5 = cVar25 + '\x04';
            } while (bVar6);
            cVar25 = cVar25 + '\x01';
          }
LAB_00b9593b:
          local_140 = local_130;
          ::std::__cxx11::string::_M_construct((ulong)&local_140,cVar25);
          ::std::__detail::__to_chars_10_impl<unsigned_long>(local_140,local_138,uVar27);
          puVar17 = (undefined8 *)
                    ::std::__cxx11::string::replace((ulong)&local_140,0,(char *)0x0,0x13b028d);
          local_160 = &local_150;
          plVar16 = puVar17 + 2;
          if ((long *)*puVar17 == plVar16) {
            local_150 = *plVar16;
            lStack_148 = puVar17[3];
          }
          else {
            local_150 = *plVar16;
            local_160 = (long *)*puVar17;
          }
          local_158 = puVar17[1];
          *puVar17 = plVar16;
          puVar17[1] = 0;
          *(undefined1 *)(puVar17 + 2) = 0;
          puVar17 = (undefined8 *)::std::__cxx11::string::append((char *)&local_160);
          local_1d0 = &local_1c0;
          puVar22 = puVar17 + 2;
          if ((ulong *)*puVar17 == puVar22) {
            local_1c0 = *puVar22;
            lStack_1b8 = puVar17[3];
          }
          else {
            local_1c0 = *puVar22;
            local_1d0 = (ulong *)*puVar17;
          }
          local_1c8 = puVar17[1];
          *puVar17 = puVar22;
          puVar17[1] = 0;
          *(undefined1 *)(puVar17 + 2) = 0;
          pvVar18 = vector<duckdb::LogicalType,_true>::operator[](pvVar1,uVar27);
          LogicalType::ToString_abi_cxx11_(&local_c8,pvVar18);
          uVar13 = 0xf;
          if (local_1d0 != &local_1c0) {
            uVar13 = local_1c0;
          }
          if (uVar13 < local_c8._M_string_length + local_1c8) {
            uVar26 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              uVar26 = local_c8.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar26 < local_c8._M_string_length + local_1c8) goto LAB_00b95aa4;
            puVar17 = (undefined8 *)
                      ::std::__cxx11::string::replace
                                ((ulong)&local_c8,0,(char *)0x0,(ulong)local_1d0);
          }
          else {
LAB_00b95aa4:
            puVar17 = (undefined8 *)
                      ::std::__cxx11::string::_M_append
                                ((char *)&local_1d0,(ulong)local_c8._M_dataplus._M_p);
          }
          local_210 = &local_200;
          puVar23 = puVar17 + 2;
          if ((undefined8 *)*puVar17 == puVar23) {
            local_200 = *puVar23;
            uStack_1f8 = puVar17[3];
          }
          else {
            local_200 = *puVar23;
            local_210 = (undefined8 *)*puVar17;
          }
          local_208 = puVar17[1];
          *puVar17 = puVar23;
          puVar17[1] = 0;
          *(undefined1 *)puVar23 = 0;
          puVar17 = (undefined8 *)::std::__cxx11::string::append((char *)&local_210);
          local_1b0 = &local_1a0;
          puVar22 = puVar17 + 2;
          if ((ulong *)*puVar17 == puVar22) {
            local_1a0 = *puVar22;
            lStack_198 = puVar17[3];
          }
          else {
            local_1a0 = *puVar22;
            local_1b0 = (ulong *)*puVar17;
          }
          local_1a8 = puVar17[1];
          *puVar17 = puVar22;
          puVar17[1] = 0;
          *(undefined1 *)(puVar17 + 2) = 0;
          pvVar19 = vector<duckdb::LogicalType,_true>::operator[](local_f8,uVar27);
          LogicalType::ToString_abi_cxx11_(&local_e8,pvVar19);
          uVar13 = 0xf;
          if (local_1b0 != &local_1a0) {
            uVar13 = local_1a0;
          }
          if (uVar13 < local_e8._M_string_length + local_1a8) {
            uVar26 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
              uVar26 = local_e8.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar26 < local_e8._M_string_length + local_1a8) goto LAB_00b95bdb;
            puVar17 = (undefined8 *)
                      ::std::__cxx11::string::replace
                                ((ulong)&local_e8,0,(char *)0x0,(ulong)local_1b0);
          }
          else {
LAB_00b95bdb:
            puVar17 = (undefined8 *)
                      ::std::__cxx11::string::_M_append
                                ((char *)&local_1b0,(ulong)local_e8._M_dataplus._M_p);
          }
          local_1f0 = &local_1e0;
          puVar23 = puVar17 + 2;
          if ((undefined8 *)*puVar17 == puVar23) {
            local_1e0 = *puVar23;
            uStack_1d8 = puVar17[3];
          }
          else {
            local_1e0 = *puVar23;
            local_1f0 = (undefined8 *)*puVar17;
          }
          local_1e8 = puVar17[1];
          *puVar17 = puVar23;
          puVar17[1] = 0;
          *(undefined1 *)puVar23 = 0;
          puVar17 = (undefined8 *)::std::__cxx11::string::append((char *)&local_1f0);
          plVar16 = puVar17 + 2;
          if ((long *)*puVar17 == plVar16) {
            local_170 = *plVar16;
            lStack_168 = puVar17[3];
            local_180 = &local_170;
          }
          else {
            local_170 = *plVar16;
            local_180 = (long *)*puVar17;
          }
          local_178 = puVar17[1];
          *puVar17 = plVar16;
          puVar17[1] = 0;
          *(undefined1 *)(puVar17 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)local_120,(ulong)local_180);
          if (local_180 != &local_170) {
            operator_delete(local_180);
          }
          if (local_1f0 != &local_1e0) {
            operator_delete(local_1f0);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p);
          }
          if (local_1b0 != &local_1a0) {
            operator_delete(local_1b0);
          }
          if (local_210 != &local_200) {
            operator_delete(local_210);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p);
          }
          if (local_1d0 != &local_1c0) {
            operator_delete(local_1d0);
          }
          if (local_160 != &local_150) {
            operator_delete(local_160);
          }
          if (local_140 != local_130) {
            operator_delete(local_140);
          }
          pvVar18 = vector<duckdb::LogicalType,_true>::operator[](pvVar1,uVar27);
          pvVar19 = vector<duckdb::LogicalType,_true>::operator[](local_f8,uVar27);
          if (pvVar19 != pvVar18) {
            pvVar19->id_ = pvVar18->id_;
            pvVar19->physical_type_ = pvVar18->physical_type_;
            shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                      (&pvVar19->type_info_,&pvVar18->type_info_);
          }
          rVar28 = vector<bool,_true>::get<true>(local_68,uVar27);
          *rVar28._M_p = *rVar28._M_p | rVar28._M_mask;
          bVar6 = false;
        }
        uVar27 = uVar27 + 1;
      }
      if (!bVar6) {
        ::std::__cxx11::string::_M_append((char *)local_188,(ulong)local_120[0]);
      }
    }
    if ((char)local_18c == '\x01' && (local_100->sniffer_user_mismatch_error)._M_string_length != 0)
    {
      pIVar20 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      InvalidInputException::InvalidInputException(pIVar20,local_188);
      __cxa_throw(pIVar20,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    ::std::vector<bool,_std::allocator<bool>_>::operator=
              ((vector<bool,_std::allocator<bool>_> *)&this->options->was_type_manually_set,
               &(this->manually_set).super_vector<bool,_std::allocator<bool>_>);
    msg = local_188;
    if (local_120[0] != local_110) {
      operator_delete(local_120[0]);
      msg = local_188;
    }
  }
  if ((char)local_18c == '\x01' && (local_100->sniffer_user_mismatch_error)._M_string_length != 0) {
    pIVar20 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    InvalidInputException::InvalidInputException(pIVar20,msg);
    __cxa_throw(pIVar20,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  ::std::vector<bool,_std::allocator<bool>_>::operator=
            ((vector<bool,_std::allocator<bool>_> *)&this->options->was_type_manually_set,
             &(this->manually_set).super_vector<bool,_std::allocator<bool>_>);
  __x = &((this->set_columns).types)->
         super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>;
  if ((__x == (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)0x0) ||
     ((__x->super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (__x->super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>)._M_impl.
      super__Vector_impl_data._M_finish)) {
    this_02 = &local_a8;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
              (this_02,&(this->detected_types).
                        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
    this_03 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_60;
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(this_03,&(this->names).
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            );
    (local_f0->return_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
    .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_a8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
         _M_impl.super__Vector_impl_data._M_start;
    (local_f0->return_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
    .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_a8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    (local_f0->return_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
    .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_a8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_a8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_48[0] = local_60[0];
  }
  else {
    this_02 = &local_88;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector(this_02,__x);
    this_03 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_48;
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(this_03,&((this->set_columns).names)->
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            );
    (local_f0->return_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
    .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_88.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
         _M_impl.super__Vector_impl_data._M_start;
    (local_f0->return_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
    .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_88.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    (local_f0->return_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
    .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_88.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_88.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  pSVar4 = local_f0;
  (local_f0->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = local_48[0];
  pbVar3 = *(pointer *)(this_03 + 0x10);
  (local_f0->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = *(pointer *)(this_03 + 8);
  (local_f0->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar3;
  *(undefined8 *)this_03 = 0;
  *(undefined8 *)(this_03 + 8) = 0;
  *(undefined8 *)(this_03 + 0x10) = 0;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(this_03);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(this_02);
  return pSVar4;
}

Assistant:

SnifferResult CSVSniffer::SniffCSV(const bool force_match) {
	buffer_manager->sniffing = true;
	// 1. Dialect Detection
	DetectDialect();
	if (buffer_manager->file_handle->compression_type != FileCompressionType::UNCOMPRESSED &&
	    buffer_manager->IsBlockUnloaded(0)) {
		buffer_manager->ResetBufferManager();
	}
	// 2. Type Detection
	DetectTypes();
	// 3. Type Refinement
	RefineTypes();
	// 4. Header Detection
	DetectHeader();
	// 5. Type Replacement
	ReplaceTypes();

	// We reset the buffer for compressed files
	// This is done because we can't easily seek on compressed files, if a buffer goes out of scope we must read from
	// the start
	if (buffer_manager->file_handle->compression_type != FileCompressionType::UNCOMPRESSED) {
		buffer_manager->ResetBufferManager();
	}
	buffer_manager->sniffing = false;
	if (best_candidate->error_handler->AnyErrors() && !options.ignore_errors.GetValue()) {
		best_candidate->error_handler->ErrorIfTypeExists(MAXIMUM_LINE_SIZE);
	}
	D_ASSERT(best_sql_types_candidates_per_column_idx.size() == names.size());
	// We are done, Set the CSV Options in the reference. Construct and return the result.
	SetResultOptions();
	options.auto_detect = true;
	// Check if everything matches
	auto &error = options.sniffer_user_mismatch_error;
	if (set_columns.IsSet()) {
		bool match = true;
		// Columns and their types were set, let's validate they match
		if (options.dialect_options.header.GetValue()) {
			// If the header exists it should match
			string header_error = "The Column names set by the user do not match the ones found by the sniffer. \n";
			auto &set_names = *set_columns.names;
			if (set_names.size() == names.size()) {
				for (idx_t i = 0; i < set_columns.Size(); i++) {
					if (set_names[i] != names[i]) {
						header_error += "Column at position: " + to_string(i) + ", Set name: " + set_names[i] +
						                ", Sniffed Name: " + names[i] + "\n";
						match = false;
					}
				}
			}

			if (!match) {
				error += header_error;
			}
		}
		match = true;
		string type_error = "The Column types set by the user do not match the ones found by the sniffer. \n";
		auto &set_types = *set_columns.types;
		if (detected_types.size() == set_columns.Size()) {
			for (idx_t i = 0; i < set_columns.Size(); i++) {
				if (set_types[i] != detected_types[i]) {
					type_error += "Column at position: " + to_string(i) + " Set type: " + set_types[i].ToString() +
					              " Sniffed type: " + detected_types[i].ToString() + "\n";
					detected_types[i] = set_types[i];
					manually_set[i] = true;
					match = false;
				}
			}
		}

		if (!match) {
			error += type_error;
		}

		if (!error.empty() && force_match) {
			throw InvalidInputException(error);
		}
		options.was_type_manually_set = manually_set;
	}
	if (!error.empty() && force_match) {
		throw InvalidInputException(error);
	}
	options.was_type_manually_set = manually_set;
	if (set_columns.IsSet()) {
		return SnifferResult(*set_columns.types, *set_columns.names);
	}
	return SnifferResult(detected_types, names);
}